

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

sx_str_block sx_findblock(char *str,char open,char close)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  sx_str_block sVar6;
  
  pcVar4 = str + 1;
  pcVar5 = (char *)0x0;
  pcVar3 = (char *)0x0;
  do {
    cVar1 = pcVar4[-1];
    if (cVar1 == '\0') {
LAB_001099a8:
      sVar6.end = pcVar5;
      sVar6.start = pcVar3;
      return sVar6;
    }
    pcVar2 = pcVar4;
    if (pcVar3 != (char *)0x0 || cVar1 != open) {
      if (pcVar3 == (char *)0x0) {
        pcVar2 = (char *)0x0;
      }
      else {
        pcVar2 = pcVar3;
        if (cVar1 == close) {
          pcVar5 = pcVar4 + -2;
          goto LAB_001099a8;
        }
      }
    }
    pcVar3 = pcVar2;
    pcVar4 = pcVar4 + 1;
  } while( true );
}

Assistant:

sx_str_block sx_findblock(const char* str, char open, char close)
{
    int count = 0;
    sx_str_block b = { NULL, NULL };

    for (char ch = *str; ch && count >= 0; ch = *++str) {
        if (!b.start && ch == open) {
            b.start = str + 1;
        } else if (b.start && ch == close) {
            b.end = str - 1;
            return b;
        }
    }

    return b;
}